

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

void Wlc_NtkAbsAddToNodeFrames(Vec_Int_t *vNodeFrames,Vec_Int_t *vLevel)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = vLevel->nSize;
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      if (0 < (long)vNodeFrames->nSize) {
        lVar2 = 0;
        do {
          if (vNodeFrames->pArray[lVar2] == vLevel->pArray[lVar3]) goto LAB_0035f32a;
          lVar2 = lVar2 + 1;
        } while (vNodeFrames->nSize != lVar2);
      }
      Vec_IntPush(vNodeFrames,vLevel->pArray[lVar3]);
      iVar1 = vLevel->nSize;
LAB_0035f32a:
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar1);
  }
  qsort(vNodeFrames->pArray,(long)vNodeFrames->nSize,4,Vec_IntSortCompare1);
  return;
}

Assistant:

void Wlc_NtkAbsAddToNodeFrames( Vec_Int_t * vNodeFrames, Vec_Int_t * vLevel ) 
{
    int i, Entry;
    Vec_IntForEachEntry( vLevel, Entry, i )
        Vec_IntPushUnique( vNodeFrames, Entry );
    Vec_IntSort( vNodeFrames, 0 );
}